

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O3

UConverter *
ucnv_createAlgorithmicConverter_63
          (UConverter *myUConverter,UConverterType type,char *locale,uint32_t options,
          UErrorCode *err)

{
  UConverter *pUVar1;
  UConverterLoadArgs local_28;
  
  local_28.pkg = (char *)0x0;
  local_28.size = 0x28;
  local_28.nestedLoads = 0;
  if ((((uint)type < 0x22) && ((0x203UL >> ((ulong)(uint)type & 0x3f) & 1) == 0)) &&
     (converterData[(uint)type]->isReferenceCounted == '\0')) {
    local_28.name = "";
    local_28._8_8_ = (ulong)options << 0x20;
    local_28.locale = locale;
    pUVar1 = ucnv_createConverterFromSharedData_63
                       (myUConverter,converterData[(uint)type],&local_28,err);
  }
  else {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    pUVar1 = (UConverter *)0x0;
  }
  return pUVar1;
}

Assistant:

UConverter *
ucnv_createAlgorithmicConverter(UConverter *myUConverter,
                                UConverterType type,
                                const char *locale, uint32_t options,
                                UErrorCode *err) {
    UConverter *cnv;
    const UConverterSharedData *sharedData;
    UConverterLoadArgs stackArgs=UCNV_LOAD_ARGS_INITIALIZER;

    UTRACE_ENTRY_OC(UTRACE_UCNV_OPEN_ALGORITHMIC);
    UTRACE_DATA1(UTRACE_OPEN_CLOSE, "open algorithmic converter type %d", (int32_t)type);

    if(type<0 || UCNV_NUMBER_OF_SUPPORTED_CONVERTER_TYPES<=type) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        UTRACE_EXIT_STATUS(U_ILLEGAL_ARGUMENT_ERROR);
        return NULL;
    }

    sharedData = converterData[type];
    if(sharedData == NULL || sharedData->isReferenceCounted) {
        /* not a valid type, or not an algorithmic converter */
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        UTRACE_EXIT_STATUS(U_ILLEGAL_ARGUMENT_ERROR);
        return NULL;
    }

    stackArgs.name = "";
    stackArgs.options = options;
    stackArgs.locale=locale;
    cnv = ucnv_createConverterFromSharedData(
            myUConverter, (UConverterSharedData *)sharedData,
            &stackArgs, err);

    UTRACE_EXIT_PTR_STATUS(cnv, *err);
    return cnv;
}